

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::InstanceArrayISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,InstanceArrayISA *this,PrimRef *prims,BBox1f *time_range
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined4 uVar1;
  LBBox3fa *pLVar2;
  size_t sVar3;
  ulong instance;
  size_t sVar4;
  float fVar5;
  BBox1f BVar6;
  float fVar8;
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar10 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  BBox1f t0t1;
  LBBox3fa lbounds;
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 local_a8 [16];
  BBox1f local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  local_a8._8_8_ = 0x7f8000007f800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  local_b8._8_8_ = 0xff800000ff800000;
  local_b8._0_8_ = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  BVar6 = Geometry::getTimeRange((Geometry *)this);
  fVar5 = time_range->lower;
  if (time_range->lower <= BVar6.lower) {
    fVar5 = BVar6.lower;
  }
  fVar8 = BVar6.upper;
  if (time_range->upper <= BVar6.upper) {
    fVar8 = time_range->upper;
  }
  local_80.upper = fVar8;
  local_80.lower = fVar5;
  if (fVar5 <= fVar8) {
    instance = r->_begin;
    if (instance < r->_end) {
      sVar3 = 0;
      local_d8._8_8_ = 0x7f8000007f800000;
      local_d8._0_8_ = 0x7f8000007f800000;
      local_a8._8_8_ = 0x7f8000007f800000;
      local_a8._0_8_ = 0x7f8000007f800000;
      local_c8.m128 = _DAT_01f7aa00;
      local_b8.m128 = _DAT_01f7aa00;
      aVar7 = _DAT_01f7aa00;
      do {
        if ((*(long *)&(this->super_InstanceArray).super_Geometry.field_0x58 != 0) ||
           (pLVar2 = (LBBox3fa *)(this->super_InstanceArray).object_ids.super_RawBufferView.ptr_ofs,
           ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)
           ((long)&(pLVar2->bounds0).lower.field_0 +
           (this->super_InstanceArray).object_ids.super_RawBufferView.stride * instance))->m128[0]
           != -NAN)) {
          pLVar2 = InstanceArray::nonlinearBounds
                             ((LBBox3fa *)&local_78.field_1,&this->super_InstanceArray,instance,
                              &local_80,&(this->super_InstanceArray).super_Geometry.time_range,
                              (this->super_InstanceArray).super_Geometry.fnumTimeSegments);
          aVar7 = local_78;
        }
        aVar7.m128 = (__m128)minps(aVar7.m128,local_58);
        auVar10 = maxps(local_68,local_48);
        fVar5 = aVar7.m128[0];
        fVar8 = aVar7.m128[1];
        fVar9 = aVar7.m128[2];
        auVar13._0_4_ = -(uint)(auVar10._0_4_ < 1.844e+18 && -1.844e+18 < fVar5);
        auVar13._4_4_ = -(uint)(auVar10._4_4_ < 1.844e+18 && -1.844e+18 < fVar8);
        auVar13._8_4_ = -(uint)(auVar10._8_4_ < 1.844e+18 && -1.844e+18 < fVar9);
        auVar13._12_4_ = -(uint)(auVar10._12_4_ < 1.844e+18 && -1.844e+18 < aVar7.m128[3]);
        uVar1 = movmskps((int)pLVar2,auVar13);
        sVar4 = k;
        if ((~(byte)uVar1 & 7) == 0) {
          aVar7.m128[3] = (float)geomID;
          aVar11._0_12_ = auVar10._0_12_;
          aVar11.m128[3] = (float)instance;
          local_d8 = minps(local_d8,(undefined1  [16])aVar7);
          local_c8.m128 = (__m128)maxps(local_c8.m128,aVar11.m128);
          auVar12._0_4_ = fVar5 + auVar10._0_4_;
          auVar12._4_4_ = fVar8 + auVar10._4_4_;
          auVar12._8_4_ = fVar9 + auVar10._8_4_;
          auVar12._12_4_ = (float)geomID + (float)instance;
          local_a8 = minps(local_a8,auVar12);
          local_b8.m128 = (__m128)maxps(local_b8.m128,auVar12);
          sVar3 = sVar3 + 1;
          sVar4 = k + 1;
          *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(prims + k) = aVar7;
          prims[k].upper.field_0 = aVar11;
        }
        instance = instance + 1;
        k = sVar4;
      } while (instance < r->_end);
    }
    else {
      sVar3 = 0;
      local_c8._8_8_ = 0xff800000ff800000;
      local_c8._0_8_ = 0xff800000ff800000;
      local_d8._8_8_ = 0x7f8000007f800000;
      local_d8._0_8_ = 0x7f8000007f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_d8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_d8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_c8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_b8._8_8_;
    __return_storage_ptr__->end = sVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;

        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = linearBounds(j, t0t1);
          if (!isvalid(lbounds.bounds()))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }